

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined8 uVar4;
  float _v [4];
  float _v_00 [4];
  int iVar5;
  _func_int **pp_Var6;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined4 *puVar18;
  _func_int *p_Var19;
  undefined4 *puVar20;
  undefined8 *puVar21;
  int y;
  int x_1;
  int iVar22;
  ulong uVar23;
  undefined8 *puVar24;
  int x_2;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  int x;
  int iVar29;
  long lVar30;
  bool bVar31;
  undefined4 uVar32;
  float fVar33;
  undefined4 uVar34;
  float fVar35;
  undefined4 uVar36;
  float fVar37;
  undefined4 uVar38;
  float fVar39;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Mat m;
  Mat bottom_blob_unpacked;
  Mat local_78;
  
  p_Var19 = this->_vptr_Padding_x86[-3];
  uVar14 = *(uint *)(&this->field_0xd0 + (long)p_Var19);
  if (((((uVar14 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var19) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var19) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var19) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var19) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var19) == 0)) {
    ncnn::Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
  iVar5 = bottom_blob->elempack;
  uVar12 = bottom_blob->elemsize;
  if ((iVar5 != 0) && (((int)uVar12 * 8) / iVar5 == 8)) {
    iVar5 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar5;
  }
  if ((iVar5 == 4) && (bottom_blob->dims - 1U < 4)) {
    iVar29 = bottom_blob->w;
    iVar8 = bottom_blob->h;
    uVar10 = bottom_blob->c;
    switch(bottom_blob->dims) {
    case 1:
      uVar14 = *(uint *)(&this->field_0xd8 + (long)p_Var19) + iVar29 * 4 +
               *(int *)(&this->field_0xdc + (long)p_Var19);
      bVar31 = (uVar14 & 3) == 0;
      if (((*(uint *)(&this->field_0xd8 + (long)p_Var19) & 3) == 0 && bVar31) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
        ncnn::Mat::create(top_blob,(int)uVar14 >> 2,(uVar12 >> 2) << bVar31 * '\x02',4,
                          opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var19 = this->_vptr_Padding_x86[-3];
          v[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
          v[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
          v[3] = (float)in_XMM1_Db;
          v[2] = (float)in_XMM1_Da;
          padding_constant_pack4_sse
                    (bottom_blob,top_blob,0,0,*(int *)(&this->field_0xd8 + (long)p_Var19) / 4,
                     *(int *)(&this->field_0xdc + (long)p_Var19) / 4,v);
          return 0;
        }
        return -100;
      }
      break;
    case 2:
      uVar10 = uVar14 + iVar8 * 4 + *(int *)(&this->field_0xd4 + (long)p_Var19);
      bVar31 = (uVar10 & 3) == 0;
      if (((uVar14 & 3) == 0 && bVar31) && (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
        ncnn::Mat::create(top_blob,iVar29 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                   *(int *)(&this->field_0xdc + (long)p_Var19),(int)uVar10 >> 2,
                          (uVar12 >> 2) << bVar31 * '\x02',4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          p_Var19 = this->_vptr_Padding_x86[-3];
          v_02[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
          v_02[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
          v_02[3] = (float)in_XMM1_Db;
          v_02[2] = (float)in_XMM1_Da;
          padding_constant_pack4_sse
                    (bottom_blob,top_blob,*(int *)(&this->field_0xd0 + (long)p_Var19) / 4,
                     *(int *)(&this->field_0xd4 + (long)p_Var19) / 4,
                     *(int *)(&this->field_0xd8 + (long)p_Var19),
                     *(int *)(&this->field_0xdc + (long)p_Var19),v_02);
          return 0;
        }
        return -100;
      }
      break;
    case 3:
      uVar28 = *(uint *)(&this->field_0xe8 + (long)p_Var19) + uVar10 * 4 +
               *(int *)(&this->field_0xec + (long)p_Var19);
      bVar31 = (uVar28 & 3) == 0;
      if ((*(uint *)(&this->field_0xe8 + (long)p_Var19) & 3) == 0 && bVar31) {
        if ((uVar28 == uVar10 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          uVar28 = (int)uVar28 >> 2;
          ncnn::Mat::create(top_blob,iVar29 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                     *(int *)(&this->field_0xdc + (long)p_Var19),
                            uVar14 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar28,
                            (uVar12 >> 2) << bVar31 * '\x02',4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar5 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            lVar3 = -0x20;
            for (uVar12 = 0; uVar12 != uVar28; uVar12 = uVar12 + 1) {
              ncnn::Mat::channel(&bottom_blob_unpacked,top_blob,(int)uVar12);
              p_Var19 = this->_vptr_Padding_x86[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                fVar33 = *(float *)(&this->field_0xe4 + (long)p_Var19);
                fVar35 = fVar33;
                fVar37 = fVar33;
                fVar39 = fVar33;
              }
              else {
                pfVar2 = (float *)(*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar12 * 0x10);
                fVar33 = *pfVar2;
                fVar35 = pfVar2[1];
                fVar37 = pfVar2[2];
                fVar39 = pfVar2[3];
              }
              iVar29 = iVar5 / -4 + (int)uVar12;
              if (iVar29 < 0 || (int)uVar10 <= iVar29) {
                _v[1] = fVar35;
                _v[0] = fVar33;
                _v[2] = fVar37;
                _v[3] = fVar39;
                ncnn::Mat::fill<float__vector(4)>(&bottom_blob_unpacked,_v);
              }
              else {
                ncnn::Mat::channel(&m,bottom_blob,iVar29);
                pp_Var6 = this->_vptr_Padding_x86;
                p_Var19 = pp_Var6[-3];
                iVar29 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                if (iVar29 == 0) {
                  v_00[1] = fVar35;
                  v_00[0] = fVar33;
                  v_00[3] = (float)in_XMM1_Db;
                  v_00[2] = (float)in_XMM1_Da;
                  padding_constant_pack4_sse
                            (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var19),
                             *(int *)(&this->field_0xd4 + (long)p_Var19),
                             *(int *)(&this->field_0xd8 + (long)p_Var19),
                             *(int *)(&this->field_0xdc + (long)p_Var19),v_00);
                  pp_Var6 = this->_vptr_Padding_x86;
                  p_Var19 = pp_Var6[-3];
                  iVar29 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                }
                if (iVar29 == 1) {
                  iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                  iVar7 = 0;
                  iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                  if (*(int *)(&this->field_0xd8 + (long)p_Var19) < 1) {
                    iVar8 = 0;
                  }
                  iVar15 = *(int *)(&this->field_0xdc + (long)p_Var19);
                  if (*(int *)(&this->field_0xdc + (long)p_Var19) < 1) {
                    iVar15 = 0;
                  }
                  puVar20 = (undefined4 *)bottom_blob_unpacked.data;
                  iVar22 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                  if (*(int *)(&this->field_0xd0 + (long)p_Var19) < 1) {
                    iVar22 = iVar7;
                  }
                  for (; iVar7 != iVar22; iVar7 = iVar7 + 1) {
                    uVar32 = *m.data;
                    uVar34 = *(undefined4 *)((long)m.data + 4);
                    uVar36 = *(undefined4 *)((long)m.data + 8);
                    uVar38 = *(undefined4 *)((long)m.data + 0xc);
                    iVar25 = iVar8;
                    while (bVar31 = iVar25 != 0, iVar25 = iVar25 + -1, bVar31) {
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar20 = puVar20 + 4;
                    }
                    lVar26 = 0;
                    for (iVar25 = 0; iVar25 < m.w; iVar25 = iVar25 + 1) {
                      puVar18 = (undefined4 *)((long)m.data + lVar26);
                      uVar32 = *puVar18;
                      uVar34 = puVar18[1];
                      uVar36 = puVar18[2];
                      uVar38 = puVar18[3];
                      puVar18 = (undefined4 *)((long)puVar20 + lVar26);
                      *puVar18 = uVar32;
                      puVar18[1] = uVar34;
                      puVar18[2] = uVar36;
                      puVar18[3] = uVar38;
                      lVar26 = lVar26 + 0x10;
                    }
                    puVar20 = (undefined4 *)((long)puVar20 + lVar26);
                    iVar25 = iVar15;
                    while (bVar31 = iVar25 != 0, iVar25 = iVar25 + -1, bVar31) {
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar20 = puVar20 + 4;
                    }
                  }
                  puVar18 = (undefined4 *)m.data;
                  for (iVar7 = 0; iVar7 < m.h; iVar7 = iVar7 + 1) {
                    uVar32 = *puVar18;
                    uVar34 = puVar18[1];
                    uVar36 = puVar18[2];
                    uVar38 = puVar18[3];
                    iVar22 = iVar8;
                    while (bVar31 = iVar22 != 0, iVar22 = iVar22 + -1, bVar31) {
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar20 = puVar20 + 4;
                    }
                    for (iVar22 = 0; iVar25 = iVar15, iVar22 < m.w; iVar22 = iVar22 + 1) {
                      uVar32 = *puVar18;
                      uVar34 = puVar18[1];
                      uVar36 = puVar18[2];
                      uVar38 = puVar18[3];
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar18 = puVar18 + 4;
                      puVar20 = puVar20 + 4;
                    }
                    while (iVar25 != 0) {
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar20 = puVar20 + 4;
                      iVar25 = iVar25 + -1;
                    }
                  }
                  puVar18 = puVar18 + -(long)(m.w << 2);
                  iVar7 = 0;
                  if (iVar29 < 1) {
                    iVar29 = iVar7;
                  }
                  for (; iVar7 != iVar29; iVar7 = iVar7 + 1) {
                    uVar32 = *puVar18;
                    uVar34 = puVar18[1];
                    uVar36 = puVar18[2];
                    uVar38 = puVar18[3];
                    iVar22 = iVar8;
                    while (bVar31 = iVar22 != 0, iVar22 = iVar22 + -1, bVar31) {
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar20 = puVar20 + 4;
                    }
                    lVar26 = 0;
                    for (iVar22 = 0; iVar22 < m.w; iVar22 = iVar22 + 1) {
                      puVar1 = (undefined4 *)((long)puVar18 + lVar26);
                      uVar32 = *puVar1;
                      uVar34 = puVar1[1];
                      uVar36 = puVar1[2];
                      uVar38 = puVar1[3];
                      puVar1 = (undefined4 *)((long)puVar20 + lVar26);
                      *puVar1 = uVar32;
                      puVar1[1] = uVar34;
                      puVar1[2] = uVar36;
                      puVar1[3] = uVar38;
                      lVar26 = lVar26 + 0x10;
                    }
                    puVar20 = (undefined4 *)((long)puVar20 + lVar26);
                    iVar22 = iVar15;
                    while (bVar31 = iVar22 != 0, iVar22 = iVar22 + -1, bVar31) {
                      *puVar20 = uVar32;
                      puVar20[1] = uVar34;
                      puVar20[2] = uVar36;
                      puVar20[3] = uVar38;
                      puVar20 = puVar20 + 4;
                    }
                  }
                  p_Var19 = pp_Var6[-3];
                  iVar29 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                }
                if (iVar29 == 2) {
                  iVar29 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                  uVar14 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
                  puVar9 = (undefined8 *)((long)(m.w * iVar29 * 4) * 4 + (long)m.data);
                  uVar23 = 0;
                  uVar13 = 0;
                  if (0 < (int)uVar14) {
                    uVar13 = (ulong)uVar14;
                  }
                  uVar16 = (ulong)*(uint *)(&this->field_0xdc + (long)p_Var19);
                  if ((int)*(uint *)(&this->field_0xdc + (long)p_Var19) < 1) {
                    uVar16 = uVar23;
                  }
                  iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                  if (iVar29 < 1) {
                    iVar29 = 0;
                  }
                  lVar26 = (long)(int)uVar14 * 0x10;
                  lVar11 = uVar13 * 0x10;
                  lVar17 = uVar16 * 0x10;
                  puVar21 = (undefined8 *)bottom_blob_unpacked.data;
                  for (; (int)uVar23 != iVar29; uVar23 = (ulong)((int)uVar23 + 1)) {
                    lVar27 = 0;
                    for (lVar30 = 0; lVar11 + lVar30 != 0; lVar30 = lVar30 + -0x10) {
                      puVar24 = (undefined8 *)((long)puVar9 + lVar30 + lVar26);
                      uVar4 = puVar24[1];
                      *(undefined8 *)((long)puVar21 + lVar27) = *puVar24;
                      ((undefined8 *)((long)puVar21 + lVar27))[1] = uVar4;
                      lVar27 = lVar27 + 0x10;
                    }
                    puVar21 = (undefined8 *)((long)puVar21 - lVar30);
                    puVar24 = puVar9;
                    for (iVar7 = 0; lVar27 = lVar3, iVar7 < m.w; iVar7 = iVar7 + 1) {
                      uVar4 = puVar24[1];
                      *puVar21 = *puVar24;
                      puVar21[1] = uVar4;
                      puVar24 = puVar24 + 2;
                      puVar21 = puVar21 + 2;
                    }
                    for (; lVar17 + lVar27 != -0x20; lVar27 = lVar27 + -0x10) {
                      uVar4 = ((undefined8 *)((long)puVar24 + lVar27))[1];
                      *puVar21 = *(undefined8 *)((long)puVar24 + lVar27);
                      puVar21[1] = uVar4;
                      puVar21 = puVar21 + 2;
                    }
                    puVar9 = puVar9 + (long)m.w * -2;
                  }
                  for (iVar29 = 0; iVar29 < m.h; iVar29 = iVar29 + 1) {
                    lVar30 = 0;
                    for (lVar27 = 0; lVar11 + lVar27 != 0; lVar27 = lVar27 + -0x10) {
                      puVar24 = (undefined8 *)((long)puVar9 + lVar27 + lVar26);
                      uVar4 = puVar24[1];
                      *(undefined8 *)((long)puVar21 + lVar30) = *puVar24;
                      ((undefined8 *)((long)puVar21 + lVar30))[1] = uVar4;
                      lVar30 = lVar30 + 0x10;
                    }
                    puVar21 = (undefined8 *)((long)puVar21 - lVar27);
                    for (iVar7 = 0; lVar27 = lVar3, iVar7 < m.w; iVar7 = iVar7 + 1) {
                      uVar4 = puVar9[1];
                      *puVar21 = *puVar9;
                      puVar21[1] = uVar4;
                      puVar9 = puVar9 + 2;
                      puVar21 = puVar21 + 2;
                    }
                    for (; lVar17 + lVar27 != -0x20; lVar27 = lVar27 + -0x10) {
                      uVar4 = ((undefined8 *)((long)puVar9 + lVar27))[1];
                      *puVar21 = *(undefined8 *)((long)puVar9 + lVar27);
                      puVar21[1] = uVar4;
                      puVar21 = puVar21 + 2;
                    }
                  }
                  puVar9 = puVar9 + (long)m.w * -4;
                  iVar29 = 0;
                  if (iVar8 < 1) {
                    iVar8 = iVar29;
                  }
                  for (; iVar29 != iVar8; iVar29 = iVar29 + 1) {
                    lVar30 = 0;
                    for (lVar27 = 0; lVar11 + lVar27 != 0; lVar27 = lVar27 + -0x10) {
                      puVar24 = (undefined8 *)((long)puVar9 + lVar27 + lVar26);
                      uVar4 = puVar24[1];
                      *(undefined8 *)((long)puVar21 + lVar30) = *puVar24;
                      ((undefined8 *)((long)puVar21 + lVar30))[1] = uVar4;
                      lVar30 = lVar30 + 0x10;
                    }
                    puVar21 = (undefined8 *)((long)puVar21 - lVar27);
                    puVar24 = puVar9;
                    for (iVar7 = 0; lVar27 = lVar3, iVar7 < m.w; iVar7 = iVar7 + 1) {
                      uVar4 = puVar24[1];
                      *puVar21 = *puVar24;
                      puVar21[1] = uVar4;
                      puVar24 = puVar24 + 2;
                      puVar21 = puVar21 + 2;
                    }
                    for (; lVar17 + lVar27 != -0x20; lVar27 = lVar27 + -0x10) {
                      uVar4 = ((undefined8 *)((long)puVar24 + lVar27))[1];
                      *puVar21 = *(undefined8 *)((long)puVar24 + lVar27);
                      puVar21[1] = uVar4;
                      puVar21 = puVar21 + 2;
                    }
                    puVar9 = puVar9 + (long)m.w * -2;
                  }
                }
                ncnn::Mat::~Mat(&m);
              }
              ncnn::Mat::~Mat(&bottom_blob_unpacked);
            }
            return 0;
          }
          return -100;
        }
      }
      break;
    case 4:
      if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0) {
        iVar5 = bottom_blob->d;
        iVar7 = *(int *)(&this->field_0xe8 + (long)p_Var19) + iVar5 +
                *(int *)(&this->field_0xec + (long)p_Var19);
        ncnn::Mat::create(top_blob,iVar29 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                   *(int *)(&this->field_0xdc + (long)p_Var19),
                          uVar14 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),iVar7,uVar10,
                          uVar12,4,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          uVar12 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar12 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
            p_Var19 = this->_vptr_Padding_x86[-3];
            if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
              fVar33 = *(float *)(&this->field_0xe4 + (long)p_Var19);
              fVar35 = fVar33;
              fVar37 = fVar33;
              fVar39 = fVar33;
            }
            else {
              pfVar2 = (float *)(*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar13 * 0x10);
              fVar33 = *pfVar2;
              fVar35 = pfVar2[1];
              fVar37 = pfVar2[2];
              fVar39 = pfVar2[3];
            }
            for (iVar29 = 0; iVar7 != iVar29; iVar29 = iVar29 + 1) {
              ncnn::Mat::channel(&m,top_blob,(int)uVar13);
              ncnn::Mat::depth(&bottom_blob_unpacked,&m,iVar29);
              ncnn::Mat::~Mat(&m);
              iVar8 = iVar29 - *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
              if (iVar8 < 0 || iVar5 <= iVar8) {
                _v_00[1] = fVar35;
                _v_00[0] = fVar33;
                _v_00[2] = fVar37;
                _v_00[3] = fVar39;
                ncnn::Mat::fill<float__vector(4)>(&bottom_blob_unpacked,_v_00);
              }
              else {
                ncnn::Mat::channel(&local_78,bottom_blob,(int)uVar13);
                ncnn::Mat::depth(&m,&local_78,
                                 iVar29 - *(int *)(&this->field_0xe8 +
                                                  (long)this->_vptr_Padding_x86[-3]));
                ncnn::Mat::~Mat(&local_78);
                p_Var19 = this->_vptr_Padding_x86[-3];
                v_01[1] = fVar35;
                v_01[0] = fVar33;
                v_01[3] = (float)in_XMM1_Db;
                v_01[2] = (float)in_XMM1_Da;
                padding_constant_pack4_sse
                          (&m,&bottom_blob_unpacked,*(int *)(&this->field_0xd0 + (long)p_Var19),
                           *(int *)(&this->field_0xd4 + (long)p_Var19),
                           *(int *)(&this->field_0xd8 + (long)p_Var19),
                           *(int *)(&this->field_0xdc + (long)p_Var19),v_01);
                ncnn::Mat::~Mat(&m);
              }
              ncnn::Mat::~Mat(&bottom_blob_unpacked);
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  ncnn::Mat::Mat(&bottom_blob_unpacked,bottom_blob);
  if (iVar5 != 1) {
    m.data = *(void **)opt;
    m.elemsize = (size_t)opt->workspace_allocator;
    m.elempack = opt->openmp_blocktime;
    m._28_1_ = opt->use_winograd_convolution;
    m._29_1_ = opt->use_sgemm_convolution;
    m._30_1_ = opt->use_int8_inference;
    m._31_1_ = opt->use_vulkan_compute;
    m.allocator = *(Allocator **)&opt->use_bf16_storage;
    m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    m._48_8_ = *(undefined8 *)&opt->flush_denormals;
    m._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    m.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&bottom_blob_unpacked,1,(Option *)&m);
  }
  iVar5 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                           &bottom_blob_unpacked,top_blob,opt);
  ncnn::Mat::~Mat(&bottom_blob_unpacked);
  return iVar5;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}